

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O3

void __thiscall
Projection::putDown(Projection *this,
                   Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi,
                   FArrayBox *phi_fine_strip,int c_lev,int f_lev,Orientation *outFaces,
                   int numOutFlowFaces,int ncStripWidth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pIVar4;
  undefined8 uVar5;
  pointer pGVar6;
  FabArray<amrex::FArrayBox> *this_00;
  uint uVar7;
  undefined **ppuVar8;
  int i;
  uint uVar9;
  uint uVar10;
  Periodicity *period;
  long lVar11;
  long lVar12;
  ulong uVar13;
  undefined8 *puVar14;
  uint uVar15;
  BATType BVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  undefined8 *puVar26;
  bool bVar27;
  Box result;
  Box bx;
  DistributionMapping dm;
  MFIter mfi;
  BoxArray ba;
  MultiFab phi_crse_strip;
  int local_3d4;
  int local_3d0;
  uint local_3c8;
  Array4<double> local_3a8;
  long local_368;
  int local_360;
  Box local_35c;
  FArrayBox *local_340;
  ulong local_338;
  long local_330;
  double *local_328;
  long local_320;
  int local_314 [3];
  _func_int **local_308;
  IndexType local_300;
  BATindexType local_2fc;
  int local_2f8 [2];
  IndexType local_2f0;
  long local_2e0;
  Projection *local_2d8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_2d0;
  Orientation *local_2c8;
  Box *local_2c0;
  long local_2b8;
  IntVect *local_2b0;
  Box *local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  DistributionMapping local_288;
  undefined1 local_278 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_268;
  int local_250;
  Vector<int,_std::allocator<int>_> *local_240;
  BoxArray local_218;
  FabArray<amrex::FArrayBox> local_1b0;
  
  local_2c8 = outFaces;
  local_340 = phi_fine_strip;
  local_2d0 = phi;
  local_2d8 = this;
  if (c_lev < f_lev) {
    local_360 = ncStripWidth + -1;
    local_2e0 = (long)c_lev;
    iVar18 = 1;
    local_3d4 = 1;
    local_3d0 = 1;
    lVar11 = (long)f_lev;
    do {
      lVar23 = lVar11 + -1;
      pIVar4 = (local_2d8->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = *(undefined8 *)pIVar4[lVar23].vect;
      iVar1 = *(int *)((long)(pIVar4 + lVar23) + 8);
      local_3d4 = (int)uVar5 * local_3d4;
      iVar18 = (int)((ulong)uVar5 >> 0x20) * iVar18;
      iVar19 = local_3d0 * iVar1;
      local_314[0] = local_3d4;
      local_314[1] = iVar18;
      local_314[2] = iVar19;
      if (0 < numOutFlowFaces) {
        pGVar6 = (local_2d8->parent->super_AmrCore).super_AmrMesh.geom.
                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_2b0 = (IntVect *)((long)(pGVar6 + lVar11 + 0xffffffffffffffff) + 0xb8);
        local_330 = (long)iVar18 << 3;
        local_338 = 0;
        local_2b8 = lVar23;
        local_2c0 = (Box *)((long)(pGVar6 + lVar11 + 0xffffffffffffffff) + 0xac);
        do {
          uVar9 = local_2c8[local_338].val % 3;
          local_218.m_bat.m_op.m_bndryReg.m_typ.itype =
               (IndexType)(IndexType)*(int *)((long)&local_2c0->smallend + 8);
          local_218.m_bat._0_8_ = *(_func_int ***)&local_2c0->smallend;
          local_278._8_4_ = *(int *)((long)local_2b0->vect + 8);
          local_278._0_8_ =
               (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               *(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
                local_2b0->vect;
          if (local_2c8[local_338].val < 3) {
            lVar11 = (long)(int)uVar9;
            BVar16 = (&local_218.m_bat.m_bat_type)[lVar11];
            *(BATType *)(local_278 + lVar11 * 4) = BVar16;
            (&local_218.m_bat.m_bat_type)[lVar11] = (BVar16 - ncStripWidth) + indexType;
            local_2f0.itype = (local_2c0->btype).itype;
          }
          else {
            local_2f0.itype = (local_2c0->btype).itype;
            local_3a8.p = (double *)(CONCAT44(local_2f0.itype >> 1,local_2f0.itype) & 0x100000001);
            local_3a8.jstride._0_4_ = local_2f0.itype >> 2 & 1;
            uVar13 = (ulong)uVar9;
            BVar16 = (~*(uint *)((long)&local_3a8.p + uVar13 * 4) & 1) +
                     *(int *)(local_278 + uVar13 * 4);
            (&local_218.m_bat.m_bat_type)[uVar13] = BVar16;
            *(BATType *)(local_278 + uVar13 * 4) = BVar16 + local_360;
          }
          local_2f0.itype = local_2f0.itype | 1 << (uVar9 & 0x1f);
          local_1b0.super_FabArrayBase.boxarray.m_bat.m_bat_type =
               (BATType)local_218.m_bat.m_op.m_bndryReg.m_typ.itype;
          local_1b0.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)local_218.m_bat._0_8_;
          local_1b0.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
               local_278._8_4_;
          local_1b0.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
               SUB84(local_278._0_8_,0);
          local_1b0.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
               SUB84(local_278._0_8_,4);
          local_308 = (_func_int **)local_218.m_bat._0_8_;
          local_300.itype = (uint)local_218.m_bat.m_op.m_bndryReg.m_typ.itype;
          local_2fc.m_typ.itype =
               (IndexType)
               (IndexType)local_1b0.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype;
          local_2f8[0] = local_1b0.super_FabArrayBase.boxarray.m_bat.m_op._4_4_;
          local_2f8[1] = local_278._8_4_;
          lVar11 = 0;
          do {
            if ((local_2f0.itype >> ((uint)lVar11 & 0x1f) & 1) == 0) {
              (&local_2fc)[lVar11].m_typ.itype = (&local_2fc)[lVar11].m_typ.itype + 1;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          local_2f0.itype = 7;
          amrex::BoxArray::BoxArray(&local_218,(Box *)&local_308);
          amrex::BoxArray::maxSize(&local_218,0x20);
          amrex::DistributionMapping::DistributionMapping
                    (&local_288,&local_218,*(int *)(amrex::ParallelContext::frames + 0x10));
          local_278._0_8_ =
               (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
          vStack_268.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_268.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_278._8_8_ = (FabArrayBase *)0x0;
          vStack_268.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_3a8.p = (double *)&PTR__FabFactory_00712918;
          amrex::MultiFab::MultiFab
                    ((MultiFab *)&local_1b0,&local_218,&local_288,1,0,(MFInfo *)local_278,
                     (FabFactory<amrex::FArrayBox> *)&local_3a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&vStack_268);
          amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    (&local_1b0,0.0,0,local_1b0.super_FabArrayBase.n_comp,
                     &local_1b0.super_FabArrayBase.n_grow);
          uVar13 = local_338;
          local_328 = local_340[local_338].super_BaseFab<double>.dptr;
          iVar2 = local_340[local_338].super_BaseFab<double>.domain.smallend.vect[0];
          local_368 = (long)local_340[local_338].super_BaseFab<double>.domain.smallend.vect[1];
          local_320 = (long)local_340[local_338].super_BaseFab<double>.domain.smallend.vect[2];
          iVar20 = local_340[local_338].super_BaseFab<double>.domain.bigend.vect[0];
          iVar3 = local_340[local_338].super_BaseFab<double>.domain.bigend.vect[1];
          amrex::MFIter::MFIter((MFIter *)local_278,&local_1b0.super_FabArrayBase,'\0');
          if ((int)vStack_268.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage < local_250) {
            local_2a8 = &local_340[uVar13].super_BaseFab<double>.domain;
            local_298 = (long)((iVar20 - iVar2) + 1);
            iVar20 = (int)local_368;
            local_328 = local_328 + -(long)iVar2;
            local_368 = local_368 * -8;
            local_2a0 = (long)((iVar3 - iVar20) + 1) << 3;
            local_320 = -local_320;
            lVar11 = local_330 * local_298;
            do {
              ppuVar8 = *(undefined ***)(local_2a8->smallend).vect;
              lVar23 = *(long *)((local_2a8->smallend).vect + 2);
              lVar21 = *(long *)(local_2a8->bigend).vect;
              uVar5 = *(undefined8 *)((local_2a8->bigend).vect + 2);
              local_3a8.kstride._0_4_ = (uint)((ulong)lVar21 >> 0x20);
              local_3a8.kstride._4_4_ = (uint)uVar5;
              local_3a8.nstride._0_4_ = (uint)((ulong)uVar5 >> 0x20);
              local_3a8.jstride._0_4_ = (uint)lVar23;
              local_3a8.jstride._4_4_ = (uint)((ulong)lVar23 >> 0x20);
              local_3a8.p._4_4_ = (uint)((ulong)ppuVar8 >> 0x20);
              uVar15 = local_3a8.p._4_4_;
              local_3c8 = local_3a8.kstride._4_4_;
              uVar9 = (uint)local_3a8.nstride;
              if (iVar18 == 1 && local_3d4 == 1) {
                local_3a8.p = (double *)ppuVar8;
                if (iVar19 != 1) goto LAB_00278fbb;
              }
              else {
                local_3a8.p._0_4_ = (uint)ppuVar8;
                if (local_3d4 != 1) {
                  if (local_3d4 == 4) {
                    if ((int)(uint)local_3a8.p < 0) {
                      local_3a8.p._0_4_ = (int)(uint)local_3a8.p >> 2;
                    }
                    else {
                      local_3a8.p._0_4_ = (uint)local_3a8.p >> 2;
                    }
                  }
                  else if (local_3d4 == 2) {
                    if ((int)(uint)local_3a8.p < 0) {
                      local_3a8.p._0_4_ = (int)(uint)local_3a8.p >> 1;
                    }
                    else {
                      local_3a8.p._0_4_ = (uint)local_3a8.p >> 1;
                    }
                  }
                  else if ((int)(uint)local_3a8.p < 0) {
                    local_3a8.p._0_4_ = ~((int)~(uint)local_3a8.p / local_3d4);
                  }
                  else {
                    local_3a8.p._0_4_ = (int)(uint)local_3a8.p / local_3d4;
                  }
                }
                if (iVar18 != 1) {
                  if (iVar18 == 4) {
                    if ((long)ppuVar8 < 0) {
                      uVar15 = (int)local_3a8.p._4_4_ >> 2;
                    }
                    else {
                      uVar15 = local_3a8.p._4_4_ >> 2;
                    }
                  }
                  else if (iVar18 == 2) {
                    if ((long)ppuVar8 < 0) {
                      uVar15 = (int)local_3a8.p._4_4_ >> 1;
                    }
                    else {
                      uVar15 = local_3a8.p._4_4_ >> 1;
                    }
                  }
                  else if ((long)ppuVar8 < 0) {
                    uVar15 = ~((int)~local_3a8.p._4_4_ / iVar18);
                  }
                  else {
                    uVar15 = (int)local_3a8.p._4_4_ / iVar18;
                  }
                }
LAB_00278fbb:
                local_3a8.p = (double *)CONCAT44(uVar15,(uint)local_3a8.p);
                if (iVar19 != 1) {
                  if (iVar19 == 4) {
                    if ((int)(uint)local_3a8.jstride < 0) {
                      local_3a8.jstride._0_4_ = (int)(uint)local_3a8.jstride >> 2;
                    }
                    else {
                      local_3a8.jstride._0_4_ = (uint)local_3a8.jstride >> 2;
                    }
                  }
                  else if (iVar19 == 2) {
                    if ((int)(uint)local_3a8.jstride < 0) {
                      local_3a8.jstride._0_4_ = (int)(uint)local_3a8.jstride >> 1;
                    }
                    else {
                      local_3a8.jstride._0_4_ = (uint)local_3a8.jstride >> 1;
                    }
                  }
                  else if ((int)(uint)local_3a8.jstride < 0) {
                    local_3a8.jstride._0_4_ = ~((int)~(uint)local_3a8.jstride / iVar19);
                  }
                  else {
                    local_3a8.jstride._0_4_ = (int)(uint)local_3a8.jstride / iVar19;
                  }
                }
                if ((uint)local_3a8.nstride == 0) {
                  uVar9 = local_3a8.jstride._4_4_;
                  if (local_3d4 != 1) {
                    if (local_3d4 == 4) {
                      uVar9 = (int)local_3a8.jstride._4_4_ >> 2;
                      if (-1 < lVar23) {
                        uVar9 = local_3a8.jstride._4_4_ >> 2;
                      }
                    }
                    else if (local_3d4 == 2) {
                      uVar9 = (int)local_3a8.jstride._4_4_ >> 1;
                      if (-1 < lVar23) {
                        uVar9 = local_3a8.jstride._4_4_ >> 1;
                      }
                    }
                    else if (lVar23 < 0) {
                      uVar9 = ~((int)~local_3a8.jstride._4_4_ / local_3d4);
                    }
                    else {
                      uVar9 = (int)local_3a8.jstride._4_4_ / local_3d4;
                    }
                  }
                  uVar25 = (uint)local_3a8.kstride;
                  if (iVar18 != 1) {
                    if (iVar18 == 4) {
                      uVar25 = (int)(uint)local_3a8.kstride >> 2;
                      if (-1 < lVar21) {
                        uVar25 = (uint)local_3a8.kstride >> 2;
                      }
                    }
                    else if (iVar18 == 2) {
                      uVar25 = (int)(uint)local_3a8.kstride >> 1;
                      if (-1 < lVar21) {
                        uVar25 = (uint)local_3a8.kstride >> 1;
                      }
                    }
                    else if (lVar21 < 0) {
                      uVar25 = ~((int)~(uint)local_3a8.kstride / iVar18);
                    }
                    else {
                      uVar25 = (int)(uint)local_3a8.kstride / iVar18;
                    }
                  }
                  if (iVar19 != 1) {
                    if (iVar19 == 4) {
                      local_3c8 = (int)local_3a8.kstride._4_4_ >> 2;
                      if (-1 < (int)local_3a8.kstride._4_4_) {
                        local_3c8 = local_3a8.kstride._4_4_ >> 2;
                      }
                    }
                    else if (iVar19 == 2) {
                      local_3c8 = (int)local_3a8.kstride._4_4_ >> 1;
                      if (-1 < (int)local_3a8.kstride._4_4_) {
                        local_3c8 = local_3a8.kstride._4_4_ >> 1;
                      }
                    }
                    else if ((int)local_3a8.kstride._4_4_ < 0) {
                      local_3c8 = ~((int)~local_3a8.kstride._4_4_ / iVar19);
                    }
                    else {
                      local_3c8 = (int)local_3a8.kstride._4_4_ / iVar19;
                    }
                  }
                  local_3a8.jstride._4_4_ = uVar9;
                  local_3a8.kstride._0_4_ = uVar25;
                  uVar9 = 0;
                }
                else {
                  local_35c.smallend.vect[0] = 0;
                  local_35c.smallend.vect[1] = 0;
                  local_35c.smallend.vect[2] = 0;
                  lVar17 = 0;
                  do {
                    if ((((uint)local_3a8.nstride >> ((uint)lVar17 & 0x1f) & 1) != 0) &&
                       (*(int *)((long)&local_3a8.jstride + lVar17 * 4 + 4) % local_314[lVar17] != 0
                       )) {
                      local_35c.smallend.vect[lVar17] = 1;
                    }
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 3);
                  uVar25 = local_3a8.jstride._4_4_;
                  if (local_3d4 != 1) {
                    if (local_3d4 == 4) {
                      uVar25 = (int)local_3a8.jstride._4_4_ >> 2;
                      if (-1 < lVar23) {
                        uVar25 = local_3a8.jstride._4_4_ >> 2;
                      }
                    }
                    else if (local_3d4 == 2) {
                      uVar25 = (int)local_3a8.jstride._4_4_ >> 1;
                      if (-1 < lVar23) {
                        uVar25 = local_3a8.jstride._4_4_ >> 1;
                      }
                    }
                    else if (lVar23 < 0) {
                      uVar25 = ~((int)~local_3a8.jstride._4_4_ / local_3d4);
                    }
                    else {
                      uVar25 = (int)local_3a8.jstride._4_4_ / local_3d4;
                    }
                  }
                  uVar24 = (uint)local_3a8.kstride;
                  if (iVar18 != 1) {
                    if (iVar18 == 4) {
                      uVar24 = (int)(uint)local_3a8.kstride >> 2;
                      if (-1 < lVar21) {
                        uVar24 = (uint)local_3a8.kstride >> 2;
                      }
                    }
                    else if (iVar18 == 2) {
                      uVar24 = (int)(uint)local_3a8.kstride >> 1;
                      if (-1 < lVar21) {
                        uVar24 = (uint)local_3a8.kstride >> 1;
                      }
                    }
                    else if (lVar21 < 0) {
                      uVar24 = ~((int)~(uint)local_3a8.kstride / iVar18);
                    }
                    else {
                      uVar24 = (int)(uint)local_3a8.kstride / iVar18;
                    }
                  }
                  if (iVar19 != 1) {
                    if (iVar19 == 4) {
                      local_3c8 = (int)local_3a8.kstride._4_4_ >> 2;
                      if (-1 < (int)local_3a8.kstride._4_4_) {
                        local_3c8 = local_3a8.kstride._4_4_ >> 2;
                      }
                    }
                    else if (iVar19 == 2) {
                      local_3c8 = (int)local_3a8.kstride._4_4_ >> 1;
                      if (-1 < (int)local_3a8.kstride._4_4_) {
                        local_3c8 = local_3a8.kstride._4_4_ >> 1;
                      }
                    }
                    else if ((int)local_3a8.kstride._4_4_ < 0) {
                      local_3c8 = ~((int)~local_3a8.kstride._4_4_ / iVar19);
                    }
                    else {
                      local_3c8 = (int)local_3a8.kstride._4_4_ / iVar19;
                    }
                  }
                  local_3c8 = local_3c8 + local_35c.smallend.vect[2];
                  local_3a8.jstride._4_4_ = uVar25 + local_35c.smallend.vect[0];
                  local_3a8.kstride._0_4_ = uVar24 + local_35c.smallend.vect[1];
                }
              }
              uVar10 = (uint)local_3a8.kstride;
              uVar24 = local_3a8.jstride._4_4_;
              uVar25 = (uint)local_3a8.jstride;
              local_3a8.kstride._4_4_ = local_3c8;
              amrex::BATransformer::operator()
                        (&local_35c,(BATransformer *)(local_278._8_8_ + 8),
                         (Box *)((long)(local_240->super_vector<int,_std::allocator<int>_>).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start
                                       [(int)vStack_268.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage] *
                                 0x1c + *(long *)&(((((BoxArray *)(local_278._8_8_ + 8))->m_ref).
                                                                                                        
                                                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->m_abox).
                                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                  .
                                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                  ._M_impl.super__Vector_impl_data));
              iVar2 = local_35c.smallend.vect[0];
              if (local_35c.smallend.vect[0] < (int)(uint)local_3a8.p) {
                iVar2 = (uint)local_3a8.p;
              }
              uVar7 = local_35c.smallend.vect[1];
              if (local_35c.smallend.vect[1] < (int)uVar15) {
                uVar7 = uVar15;
              }
              uVar15 = local_35c.smallend.vect[2];
              if (local_35c.smallend.vect[2] < (int)uVar25) {
                uVar15 = uVar25;
              }
              uVar25 = local_35c.bigend.vect[0];
              if ((int)uVar24 < local_35c.bigend.vect[0]) {
                uVar25 = uVar24;
              }
              uVar24 = local_35c.bigend.vect[1];
              if ((int)uVar10 < local_35c.bigend.vect[1]) {
                uVar24 = uVar10;
              }
              uVar10 = local_35c.bigend.vect[2];
              if ((int)local_3c8 < local_35c.bigend.vect[2]) {
                uVar10 = local_3c8;
              }
              if ((((iVar2 <= (int)uVar25) && ((int)uVar7 <= (int)uVar24)) &&
                  ((int)uVar15 <= (int)uVar10)) && (uVar9 < 8)) {
                amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                          (&local_3a8,&local_1b0,(MFIter *)local_278);
                lVar21 = (long)(int)uVar7;
                lVar23 = CONCAT44(local_3a8.jstride._4_4_,(uint)local_3a8.jstride) * 8;
                local_290 = (lVar21 - local_3a8.begin.y) * lVar23 + (long)iVar2 * 8 +
                            (long)local_3a8.begin.x * -8 + (long)local_3a8.p;
                iVar20 = local_3d0 * iVar1 * uVar15;
                do {
                  lVar22 = ((long)(int)uVar15 - (long)local_3a8.begin.z) *
                           CONCAT44(local_3a8.kstride._4_4_,(uint)local_3a8.kstride) * 8 + local_290
                  ;
                  puVar14 = (undefined8 *)
                            ((long)local_328 +
                            ((iVar20 + local_320) * local_2a0 + local_330 * lVar21 + local_368) *
                            local_298 + (long)iVar2 * (long)local_3d4 * 8);
                  lVar17 = lVar21;
                  do {
                    lVar12 = 0;
                    puVar26 = puVar14;
                    do {
                      *(undefined8 *)(lVar22 + lVar12 * 8) = *puVar26;
                      lVar12 = lVar12 + 1;
                      puVar26 = puVar26 + local_3d4;
                    } while ((uVar25 - iVar2) + 1 != (int)lVar12);
                    lVar17 = lVar17 + 1;
                    lVar22 = lVar22 + lVar23;
                    puVar14 = (undefined8 *)((long)puVar14 + lVar11);
                  } while (uVar24 + 1 != (int)lVar17);
                  iVar20 = iVar20 + iVar19;
                  bVar27 = uVar15 != uVar10;
                  uVar15 = uVar15 + 1;
                } while (bVar27);
              }
              amrex::MFIter::operator++((MFIter *)local_278);
            } while ((int)vStack_268.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage < local_250);
          }
          amrex::MFIter::~MFIter((MFIter *)local_278);
          lVar23 = local_2b8;
          this_00 = &(local_2d0->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                     ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[local_2b8]->
                     super_FabArray<amrex::FArrayBox>;
          period = amrex::Periodicity::NonPeriodic();
          amrex::FabArray<amrex::FArrayBox>::ParallelCopy(this_00,&local_1b0,period,COPY);
          amrex::MultiFab::~MultiFab((MultiFab *)&local_1b0);
          if (local_288.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_288.m_ref.
                       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          amrex::BoxArray::~BoxArray(&local_218);
          local_338 = local_338 + 1;
        } while (local_338 != (uint)numOutFlowFaces);
      }
      lVar11 = lVar23;
      local_3d0 = iVar19;
    } while (local_2e0 < lVar23);
  }
  return;
}

Assistant:

void
Projection::putDown (const Vector<MultiFab*>& phi,
                     FArrayBox*         phi_fine_strip,
                     int                c_lev,
                     int                f_lev,
                     const Orientation* outFaces,
                     int                numOutFlowFaces,
                     int                ncStripWidth)
{
    BL_PROFILE("Projection::putDown()");
    //
    // Put down to coarser levels.
    //
    const int nCompPhi = 1; // phi_fine_strip.nComp();
    const int nGrow    = 0; // phi_fine_strip.nGrow();
    IntVect ratio      = IntVect::TheUnitVector();

    for (int lev = f_lev-1; lev >= c_lev; lev--)
    {
        ratio *= parent->refRatio(lev);
        const Box& domainC = parent->Geom(lev).Domain();

        for (int iface = 0; iface < numOutFlowFaces; iface++)
        {
            Box phiC_strip =
                amrex::surroundingNodes(amrex::bdryNode(domainC, outFaces[iface], ncStripWidth));
            phiC_strip.grow(nGrow);
            BoxArray ba(phiC_strip);

            // FIXME: this size may need adjusting
            ba.maxSize(32);

            DistributionMapping dm{ba};
            MultiFab phi_crse_strip(ba, dm, nCompPhi, 0);
            phi_crse_strip.setVal(0);
            const auto& phi_f_arr = phi_fine_strip[iface].array();

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(phi_crse_strip); mfi.isValid(); ++mfi)
            {
                Box ovlp = amrex::coarsen(phi_fine_strip[iface].box(),ratio) & mfi.validbox();
                if (ovlp.ok())
                {
                    const auto& phi_c_arr = phi_crse_strip.array(mfi);
                    ParallelFor(ovlp, [phi_c_arr,phi_f_arr,ratio]
                    AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                    {
                       phi_c_arr(i,j,k) = phi_f_arr(i*ratio[0],j*ratio[1],k*ratio[2]);
                    });
                }
            }
            phi[lev]->ParallelCopy(phi_crse_strip);
        }
    }
}